

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O1

IOTHUB_MESSAGING_HANDLE
IoTHubMessaging_LL_Create(IOTHUB_SERVICE_CLIENT_AUTH_HANDLE serviceClientHandle)

{
  int iVar1;
  IOTHUB_MESSAGING_HANDLE __s;
  LOGGER_LOG p_Var2;
  SINGLYLINKEDLIST_HANDLE pSVar3;
  char *pcVar4;
  
  if (serviceClientHandle == (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "serviceClientHandle input parameter cannot be NULL";
      iVar1 = 0x3a2;
LAB_001334b5:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Create",iVar1,1,pcVar4);
      return (IOTHUB_MESSAGING_HANDLE)0x0;
    }
  }
  else {
    pcVar4 = serviceClientHandle->hostname;
    if (pcVar4 == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "authInfo->hostName input parameter cannot be NULL";
        iVar1 = 0x3ab;
        goto LAB_001334b5;
      }
    }
    else if (serviceClientHandle->iothubName == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "authInfo->iothubName input parameter cannot be NULL";
        iVar1 = 0x3b0;
        goto LAB_001334b5;
      }
    }
    else if (serviceClientHandle->iothubSuffix == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "authInfo->iothubSuffix input parameter cannot be NULL";
        iVar1 = 0x3b5;
        goto LAB_001334b5;
      }
    }
    else if (serviceClientHandle->keyName == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "authInfo->keyName input parameter cannot be NULL";
        iVar1 = 0x3ba;
        goto LAB_001334b5;
      }
    }
    else if (serviceClientHandle->sharedAccessKey == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "authInfo->sharedAccessKey input parameter cannot be NULL";
        iVar1 = 0x3bf;
        goto LAB_001334b5;
      }
    }
    else {
      __s = (IOTHUB_MESSAGING_HANDLE)malloc(0xe0);
      if (__s == (IOTHUB_MESSAGING_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          pcVar4 = "Malloc failed for IOTHUB_MESSAGING";
          iVar1 = 0x3c4;
          goto LAB_001334b5;
        }
      }
      else {
        memset(__s,0,0xe0);
        iVar1 = mallocAndStrcpy_s(&__s->hostname,pcVar4);
        if (iVar1 == 0) {
          iVar1 = mallocAndStrcpy_s(&__s->iothubName,serviceClientHandle->iothubName);
          if (iVar1 == 0) {
            iVar1 = mallocAndStrcpy_s(&__s->iothubSuffix,serviceClientHandle->iothubSuffix);
            if (iVar1 == 0) {
              iVar1 = mallocAndStrcpy_s(&__s->sharedAccessKey,serviceClientHandle->sharedAccessKey);
              if (iVar1 == 0) {
                iVar1 = mallocAndStrcpy_s(&__s->keyName,serviceClientHandle->keyName);
                if (iVar1 == 0) {
                  pSVar3 = singlylinkedlist_create();
                  __s->send_callback_data = pSVar3;
                  if (pSVar3 != (SINGLYLINKEDLIST_HANDLE)0x0) {
                    __s->max_send_queue_size = 0xffffffffffffffff;
                    return __s;
                  }
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                              ,"IoTHubMessaging_LL_Create",0x3f4,1,
                              "Failed creating send_callback_data");
                  }
                  free(__s->hostname);
                  free(__s->iothubName);
                  free(__s->iothubSuffix);
                  free(__s->sharedAccessKey);
                  pcVar4 = __s->keyName;
                }
                else {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                              ,"IoTHubMessaging_LL_Create",0x3ea,1,
                              "mallocAndStrcpy_s failed for keyName");
                  }
                  free(__s->hostname);
                  free(__s->iothubName);
                  free(__s->iothubSuffix);
                  pcVar4 = __s->sharedAccessKey;
                }
              }
              else {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                            ,"IoTHubMessaging_LL_Create",0x3e1,1,
                            "mallocAndStrcpy_s failed for sharedAccessKey");
                }
                free(__s->hostname);
                free(__s->iothubName);
                pcVar4 = __s->iothubSuffix;
              }
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                          ,"IoTHubMessaging_LL_Create",0x3d9,1,
                          "mallocAndStrcpy_s failed for iothubSuffix");
              }
              free(__s->hostname);
              pcVar4 = __s->iothubName;
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"IoTHubMessaging_LL_Create",0x3d2,1,
                        "mallocAndStrcpy_s failed for iothubName");
            }
            pcVar4 = __s->hostname;
          }
          free(pcVar4);
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"IoTHubMessaging_LL_Create",0x3cc,1,"mallocAndStrcpy_s failed for hostName");
          }
        }
        free(__s);
      }
    }
  }
  return (IOTHUB_MESSAGING_HANDLE)0x0;
}

Assistant:

IOTHUB_MESSAGING_HANDLE IoTHubMessaging_LL_Create(IOTHUB_SERVICE_CLIENT_AUTH_HANDLE serviceClientHandle)
{
    IOTHUB_MESSAGING_HANDLE result;

    if (serviceClientHandle == NULL)
    {
        LogError("serviceClientHandle input parameter cannot be NULL");
        result = NULL;
    }
    else
    {
        IOTHUB_SERVICE_CLIENT_AUTH* serviceClientAuth = (IOTHUB_SERVICE_CLIENT_AUTH*)serviceClientHandle;

        if (serviceClientAuth->hostname == NULL)
        {
            LogError("authInfo->hostName input parameter cannot be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->iothubName == NULL)
        {
            LogError("authInfo->iothubName input parameter cannot be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->iothubSuffix == NULL)
        {
            LogError("authInfo->iothubSuffix input parameter cannot be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->keyName == NULL)
        {
            LogError("authInfo->keyName input parameter cannot be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->sharedAccessKey == NULL)
        {
            LogError("authInfo->sharedAccessKey input parameter cannot be NULL");
            result = NULL;
        }
        else if ((result = (IOTHUB_MESSAGING*)malloc(sizeof(IOTHUB_MESSAGING))) == NULL)
        {
            LogError("Malloc failed for IOTHUB_MESSAGING");
        }
        else
        {
            memset(result, 0, sizeof(IOTHUB_MESSAGING) );

            if (mallocAndStrcpy_s(&result->hostname, serviceClientAuth->hostname) != 0)
            {
                LogError("mallocAndStrcpy_s failed for hostName");
                free(result);
                result = NULL;
            }
            else if (mallocAndStrcpy_s(&result->iothubName, serviceClientAuth->iothubName) != 0)
            {
                LogError("mallocAndStrcpy_s failed for iothubName");
                free(result->hostname);
                free(result);
                result = NULL;
            }
            else if (mallocAndStrcpy_s(&result->iothubSuffix, serviceClientAuth->iothubSuffix) != 0)
            {
                LogError("mallocAndStrcpy_s failed for iothubSuffix");
                free(result->hostname);
                free(result->iothubName);
                free(result);
                result = NULL;
            }
            else if (mallocAndStrcpy_s(&result->sharedAccessKey, serviceClientAuth->sharedAccessKey) != 0)
            {
                LogError("mallocAndStrcpy_s failed for sharedAccessKey");
                free(result->hostname);
                free(result->iothubName);
                free(result->iothubSuffix);
                free(result);
                result = NULL;
            }
            else if (mallocAndStrcpy_s(&result->keyName, serviceClientAuth->keyName) != 0)
            {
                LogError("mallocAndStrcpy_s failed for keyName");
                free(result->hostname);
                free(result->iothubName);
                free(result->iothubSuffix);
                free(result->sharedAccessKey);
                free(result);
                result = NULL;
            }
            else if ((result->send_callback_data = singlylinkedlist_create()) == NULL)
            {
                LogError("Failed creating send_callback_data");
                free(result->hostname);
                free(result->iothubName);
                free(result->iothubSuffix);
                free(result->sharedAccessKey);
                free(result->keyName);
                free(result);
                result = NULL;
            }
            else
            {
                result->max_send_queue_size = DEFAULT_MAX_SEND_QUEUE_SIZE;
            }
        }
    }
    return result;
}